

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int int_x509_param_set_hosts(X509_VERIFY_PARAM *param,int mode,char *name,size_t namelen)

{
  void *pvVar1;
  char *orig_ptr;
  OPENSSL_STACK *sk;
  size_t sVar2;
  
  if (namelen == 0 || name == (char *)0x0) {
    return 0;
  }
  pvVar1 = memchr(name,0,namelen);
  if (pvVar1 == (void *)0x0) {
    if ((mode == 0) && ((OPENSSL_STACK *)param->hosts != (OPENSSL_STACK *)0x0)) {
      OPENSSL_sk_pop_free_ex
                ((OPENSSL_STACK *)param->hosts,sk_OPENSSL_STRING_call_free_func,str_free);
      param->hosts = (stack_st_OPENSSL_STRING *)0x0;
    }
    orig_ptr = OPENSSL_strndup(name,namelen);
    if (orig_ptr != (char *)0x0) {
      sk = (OPENSSL_STACK *)param->hosts;
      if (sk == (OPENSSL_STACK *)0x0) {
        sk = OPENSSL_sk_new_null();
        param->hosts = (stack_st_OPENSSL_STRING *)sk;
        if (sk == (OPENSSL_STACK *)0x0) {
          OPENSSL_free(orig_ptr);
          return 0;
        }
      }
      sVar2 = OPENSSL_sk_push(sk,orig_ptr);
      if (sVar2 != 0) {
        return 1;
      }
      OPENSSL_free(orig_ptr);
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)param->hosts);
      if (sVar2 == 0) {
        OPENSSL_sk_free((OPENSSL_STACK *)param->hosts);
        param->hosts = (stack_st_OPENSSL_STRING *)0x0;
      }
    }
  }
  return 0;
}

Assistant:

static int int_x509_param_set_hosts(X509_VERIFY_PARAM *param, int mode,
                                    const char *name, size_t namelen) {
  char *copy;

  if (name == NULL || namelen == 0) {
    // Unlike OpenSSL, we reject trying to set or add an empty name.
    return 0;
  }

  // Refuse names with embedded NUL bytes.
  // XXX: Do we need to push an error onto the error stack?
  if (name && OPENSSL_memchr(name, '\0', namelen)) {
    return 0;
  }

  if (mode == SET_HOST && param->hosts) {
    sk_OPENSSL_STRING_pop_free(param->hosts, str_free);
    param->hosts = NULL;
  }

  copy = OPENSSL_strndup(name, namelen);
  if (copy == NULL) {
    return 0;
  }

  if (param->hosts == NULL &&
      (param->hosts = sk_OPENSSL_STRING_new_null()) == NULL) {
    OPENSSL_free(copy);
    return 0;
  }

  if (!sk_OPENSSL_STRING_push(param->hosts, copy)) {
    OPENSSL_free(copy);
    if (sk_OPENSSL_STRING_num(param->hosts) == 0) {
      sk_OPENSSL_STRING_free(param->hosts);
      param->hosts = NULL;
    }
    return 0;
  }

  return 1;
}